

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRString * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRString>::allocate<spirv_cross::SPIRString&>
          (ObjectPool<spirv_cross::SPIRString> *this,SPIRString *p)

{
  uint uVar1;
  SPIRString *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRString **ppSVar4;
  SPIRString *ptr;
  uint local_34;
  SPIRString *pSStack_30;
  uint i;
  SPIRString *ptr_1;
  SPIRString *pSStack_20;
  uint num_objects;
  SPIRString *p_local;
  ObjectPool<spirv_cross::SPIRString> *this_local;
  
  pSStack_20 = p;
  p_local = (SPIRString *)this;
  bVar2 = VectorView<spirv_cross::SPIRString_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRString_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRString,_spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_30 = (SPIRString *)malloc((ulong)ptr_1._4_4_ * 0x30);
    if (pSStack_30 == (SPIRString *)0x0) {
      return (SPIRString *)0x0;
    }
    for (local_34 = 0; local_34 < ptr_1._4_4_; local_34 = local_34 + 1) {
      ptr = pSStack_30 + local_34;
      SmallVector<spirv_cross::SPIRString_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRString*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRString,spirv_cross::ObjectPool<spirv_cross::SPIRString>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd0);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRString_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRString_*>);
  this_00 = *ppSVar4;
  SmallVector<spirv_cross::SPIRString_*,_0UL>::pop_back(&this->vacants);
  SPIRString::SPIRString(this_00,pSStack_20);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}